

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextDocument::setTextWidth(QTextDocument *this,qreal width)

{
  qreal *this_00;
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_50;
  QSizeF local_48;
  QSizeF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.wd = *(qreal *)(*(long *)&this->field_0x8 + 0x298);
  local_38.ht = *(qreal *)(*(long *)&this->field_0x8 + 0x2a0);
  pQVar1 = QtPrivateLogging::lcLayout();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_50,"page size");
    local_48.wd = (qreal)pQVar2->stream;
    ((Stream *)local_48.wd)->ref = ((Stream *)local_48.wd)->ref + 1;
    this_00 = &local_48.ht;
    ::operator<<((QDebug *)this_00,&local_48);
    pQVar2 = QDebug::operator<<((QDebug *)this_00,"-> width");
    QDebug::operator<<(pQVar2,width);
    QDebug::~QDebug((QDebug *)this_00);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_50);
  }
  local_38.ht = -1.0;
  local_38.wd = width;
  setPageSize(this,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setTextWidth(qreal width)
{
    Q_D(QTextDocument);
    QSizeF sz = d->pageSize;

    qCDebug(lcLayout) << "page size" << sz << "-> width" << width;
    sz.setWidth(width);
    sz.setHeight(-1);
    setPageSize(sz);
}